

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SF_FlateLzwDecode.cc
# Opt level: O2

bool __thiscall
SF_FlateLzwDecode::setDecodeParms(SF_FlateLzwDecode *this,QPDFObjectHandle *decode_parms)

{
  _Rb_tree_node_base *__lhs;
  bool bVar1;
  uint uVar2;
  unsigned_long_long uVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  QPDFObjectHandle value;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  QPDFLogger *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  QPDFObjectHandle local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  bVar1 = QPDFObjectHandle::isNull(decode_parms);
  bVar5 = true;
  if (!bVar1) {
    uVar3 = Pl_Flate::memory_limit();
    QPDFObjectHandle::getKeys_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60,decode_parms);
    for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      __lhs = p_Var4 + 1;
      QPDFObjectHandle::getKey(&local_70,(string *)decode_parms);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"/Predictor");
      if (bVar1) {
        bVar1 = QPDFObjectHandle::isInteger(&local_70);
        if (bVar1) {
          uVar2 = QPDFObjectHandle::getIntValueAsInt(&local_70);
          this->predictor = uVar2;
          if ((uVar2 < 0x10) && ((0xfc06U >> (uVar2 & 0x1f) & 1) != 0)) goto LAB_001fc0b1;
        }
LAB_001fc104:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_70.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        bVar5 = false;
        goto LAB_001fc110;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"/Columns");
      if ((bVar1) ||
         ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__lhs,"/Colors"), bVar1 ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)__lhs,"/BitsPerComponent"), bVar1)))) {
        bVar1 = QPDFObjectHandle::isInteger(&local_70);
        if (bVar1) {
          uVar2 = QPDFObjectHandle::getIntValueAsInt(&local_70);
          if (uVar2 <= uVar3 || uVar3 == 0) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"/Columns");
            if (bVar1) {
              this->columns = uVar2;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"/Colors");
              if (bVar1) {
                this->colors = uVar2;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"/BitsPerComponent");
                if (bVar1) {
                  this->bits_per_component = uVar2;
                }
              }
            }
            goto LAB_001fc0b1;
          }
          QPDFLogger::defaultLogger();
          QPDFLogger::warn(local_80,"SF_FlateLzwDecode parameter exceeds PL_Flate memory limit\n");
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
        }
        goto LAB_001fc104;
      }
      if ((this->lzw == true) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"/EarlyChange"), bVar1)) {
        bVar1 = QPDFObjectHandle::isInteger(&local_70);
        if (bVar1) {
          uVar2 = QPDFObjectHandle::getIntValueAsInt(&local_70);
          this->early_code_change = uVar2 == 1;
          if (uVar2 < 2) goto LAB_001fc0b1;
        }
        goto LAB_001fc104;
      }
LAB_001fc0b1:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    bVar5 = this->columns != 0 || this->predictor < 2;
LAB_001fc110:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return bVar5;
}

Assistant:

bool
SF_FlateLzwDecode::setDecodeParms(QPDFObjectHandle decode_parms)
{
    if (decode_parms.isNull()) {
        return true;
    }

    auto memory_limit = Pl_Flate::memory_limit();

    std::set<std::string> keys = decode_parms.getKeys();
    for (auto const& key: keys) {
        QPDFObjectHandle value = decode_parms.getKey(key);
        if (key == "/Predictor") {
            if (value.isInteger()) {
                predictor = value.getIntValueAsInt();
                if (!(predictor == 1 || predictor == 2 || (predictor >= 10 && predictor <= 15))) {
                    return false;
                }
            } else {
                return false;
            }
        } else if (key == "/Columns" || key == "/Colors" || key == "/BitsPerComponent") {
            if (value.isInteger()) {
                int val = value.getIntValueAsInt();
                if (memory_limit && static_cast<unsigned int>(val) > memory_limit) {
                    QPDFLogger::defaultLogger()->warn(
                        "SF_FlateLzwDecode parameter exceeds PL_Flate memory limit\n");
                    return false;
                }
                if (key == "/Columns") {
                    columns = val;
                } else if (key == "/Colors") {
                    colors = val;
                } else if (key == "/BitsPerComponent") {
                    bits_per_component = val;
                }
            } else {
                return false;
            }
        } else if (lzw && (key == "/EarlyChange")) {
            if (value.isInteger()) {
                int earlychange = value.getIntValueAsInt();
                early_code_change = (earlychange == 1);
                if (!(earlychange == 0 || earlychange == 1)) {
                    return false;
                }
            } else {
                return false;
            }
        }
    }

    if (predictor > 1 && columns == 0) {
        return false;
    }

    return true;
}